

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O0

double __thiscall S1Interval::GetDirectedHausdorffDistance(S1Interval *this,S1Interval *y)

{
  bool bVar1;
  ostream *poVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  double local_b0;
  double local_98;
  S2LogMessage local_70;
  S2LogMessageVoidify local_59;
  S1Interval local_58;
  double local_48;
  double lo_lo;
  double local_30;
  double hi_hi;
  double y_complement_center;
  S1Interval *y_local;
  S1Interval *this_local;
  
  y_complement_center = (double)y;
  y_local = this;
  bVar1 = Contains(y,this);
  if (bVar1) {
    this_local = (S1Interval *)0x0;
  }
  else {
    bVar1 = is_empty((S1Interval *)y_complement_center);
    if (bVar1) {
      this_local = (S1Interval *)0x400921fb54442d18;
    }
    else {
      hi_hi = GetComplementCenter((S1Interval *)y_complement_center);
      bVar1 = Contains(this,hi_hi);
      if (bVar1) {
        dVar4 = hi((S1Interval *)y_complement_center);
        this_local = (S1Interval *)PositiveDistance(dVar4,hi_hi);
      }
      else {
        dVar4 = hi((S1Interval *)y_complement_center);
        S1Interval((S1Interval *)&lo_lo,dVar4,hi_hi);
        dVar4 = hi(this);
        bVar1 = Contains((S1Interval *)&lo_lo,dVar4);
        if (bVar1) {
          dVar4 = hi((S1Interval *)y_complement_center);
          dVar5 = hi(this);
          local_98 = PositiveDistance(dVar4,dVar5);
        }
        else {
          local_98 = 0.0;
        }
        dVar4 = hi_hi;
        local_30 = local_98;
        dVar5 = lo((S1Interval *)y_complement_center);
        S1Interval(&local_58,dVar4,dVar5);
        dVar4 = lo(this);
        bVar1 = Contains(&local_58,dVar4);
        if (bVar1) {
          dVar4 = lo(this);
          dVar5 = lo((S1Interval *)y_complement_center);
          local_b0 = PositiveDistance(dVar4,dVar5);
        }
        else {
          local_b0 = 0.0;
        }
        local_48 = local_b0;
        if (local_30 <= 0.0 && local_b0 <= 0.0) {
          S2FatalLogMessage::S2FatalLogMessage
                    ((S2FatalLogMessage *)&local_70,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s1interval.cc"
                     ,0x9f,kFatal,(ostream *)&std::cerr);
          poVar2 = S2LogMessage::stream(&local_70);
          poVar2 = std::operator<<(poVar2,"Check failed: hi_hi > 0 || lo_lo > 0 ");
          S2LogMessageVoidify::operator&(&local_59,poVar2);
          S2FatalLogMessage::~S2FatalLogMessage((S2FatalLogMessage *)&local_70);
        }
        pdVar3 = std::max<double>(&local_30,&local_48);
        this_local = (S1Interval *)*pdVar3;
      }
    }
  }
  return (double)this_local;
}

Assistant:

double S1Interval::GetDirectedHausdorffDistance(const S1Interval& y) const {
  if (y.Contains(*this)) return 0.0;  // this includes the case *this is empty
  if (y.is_empty()) return M_PI;  // maximum possible distance on S1

  double y_complement_center = y.GetComplementCenter();
  if (Contains(y_complement_center)) {
    return PositiveDistance(y.hi(), y_complement_center);
  } else {
    // The Hausdorff distance is realized by either two hi() endpoints or two
    // lo() endpoints, whichever is farther apart.
    double hi_hi = S1Interval(y.hi(), y_complement_center).Contains(hi()) ?
        PositiveDistance(y.hi(), hi()) : 0;
    double lo_lo = S1Interval(y_complement_center, y.lo()).Contains(lo()) ?
        PositiveDistance(lo(), y.lo()) : 0;
    S2_DCHECK(hi_hi > 0 || lo_lo > 0);
    return max(hi_hi, lo_lo);
  }
}